

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

int qt_create_pipe(int *pipe)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = *pipe;
  if (iVar2 != -1) {
    do {
      iVar1 = close(iVar2);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  iVar2 = pipe[1];
  if (iVar2 != -1) {
    do {
      iVar1 = close(iVar2);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  iVar2 = pipe2(pipe,0x80000);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    qErrnoWarning("QProcess: Cannot create pipe");
    *piVar3 = iVar1;
  }
  return iVar2;
}

Assistant:

static int qt_create_pipe(int *pipe)
{
    if (pipe[0] != -1)
        qt_safe_close(pipe[0]);
    if (pipe[1] != -1)
        qt_safe_close(pipe[1]);
    int pipe_ret = qt_safe_pipe(pipe);
    if (pipe_ret != 0) {
        QScopedValueRollback rollback(errno);
        qErrnoWarning("QProcess: Cannot create pipe");
    }
    return pipe_ret;
}